

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

HeapTypeGenerator *
wasm::HeapTypeGenerator::create
          (HeapTypeGenerator *__return_storage_ptr__,Random *rand,FeatureSet features,size_t n)

{
  HeapTypeGeneratorImpl local_150;
  size_t local_28;
  size_t n_local;
  Random *rand_local;
  HeapTypeGenerator *pHStack_10;
  FeatureSet features_local;
  
  local_28 = n;
  n_local = (size_t)rand;
  rand_local._4_4_ = features.features;
  pHStack_10 = __return_storage_ptr__;
  anon_unknown_24::HeapTypeGeneratorImpl::HeapTypeGeneratorImpl(&local_150,rand,features,n);
  HeapTypeGenerator(__return_storage_ptr__,&local_150.result);
  anon_unknown_24::HeapTypeGeneratorImpl::~HeapTypeGeneratorImpl(&local_150);
  return __return_storage_ptr__;
}

Assistant:

HeapTypeGenerator
HeapTypeGenerator::create(Random& rand, FeatureSet features, size_t n) {
  return HeapTypeGeneratorImpl(rand, features, n).result;
}